

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator.cpp
# Opt level: O2

void __thiscall
helics::Translator::setTranslatorOperations
          (Translator *this,shared_ptr<helics::TranslatorOperations> *translatorOps)

{
  uint uVar1;
  Core *pCVar2;
  element_type *peVar3;
  undefined8 local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  std::__shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->transOp).
              super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>,
             &translatorOps->
              super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>);
  pCVar2 = (this->super_Interface).mCore;
  if (pCVar2 != (Core *)0x0) {
    uVar1 = (this->super_Interface).handle.hid;
    peVar3 = (this->transOp).
             super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar3 == (element_type *)0x0) {
      local_28 = 0;
      _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      (*peVar3->_vptr_TranslatorOperations[4])(&local_28);
    }
    (*pCVar2->_vptr_Core[0x55])(pCVar2,(ulong)uVar1,&local_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_20);
  }
  return;
}

Assistant:

void Translator::setTranslatorOperations(std::shared_ptr<TranslatorOperations> translatorOps)
{
    transOp = std::move(translatorOps);
    if (mCore != nullptr) {
        mCore->setTranslatorOperator(handle, (transOp) ? transOp->getOperator() : nullptr);
    }
}